

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Image_Function_Helper::Histogram
          (HistogramForm8 histogram,Image *image,uint32_t x,uint32_t y,Image *mask,uint32_t maskX,
          uint32_t maskY,uint32_t width,uint32_t height)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  code *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  uint32_t in_R8D;
  undefined8 in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined4 in_stack_00000020;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *histogramTable;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)
             CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc
             ,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,(uint32_t)((ulong)in_RDI >> 0x20),
             (uint32_t)in_RDI,in_R8D,(uint32_t)in_RDX);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11462e);
  (*in_RSI)(in_RDX,in_ECX,in_R8D,in_R9,in_stack_00000008,in_stack_00000010,in_stack_00000018,
            in_stack_00000020);
  return in_RDI;
}

Assistant:

std::vector < uint32_t > Histogram( FunctionTable::HistogramForm8 histogram,
                                        const Image & image, uint32_t x, uint32_t y, const Image & mask, uint32_t maskX, uint32_t maskY,
                                        uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, x, y, mask, maskX, maskY, width, height );

        std::vector < uint32_t > histogramTable;

        histogram( image, x, y, mask, maskX, maskY, width, height, histogramTable );

        return histogramTable;
    }